

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.cc
# Opt level: O0

int main(void)

{
  allocator local_191;
  string local_190;
  anon_class_1_0_00000001 local_169;
  function<std::shared_ptr<webpp::Response>_(webpp::Request_&)> local_168;
  allocator local_131;
  string local_130;
  undefined1 local_110 [8];
  Application app;
  
  app._252_4_ = 0;
  webpp::Application::Application((Application *)local_110,0x3039,4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"/",&local_131);
  std::function<std::shared_ptr<webpp::Response>(webpp::Request&)>::function<main::__0,void>
            ((function<std::shared_ptr<webpp::Response>(webpp::Request&)> *)&local_168,&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"GET",&local_191);
  webpp::Application::add_route((Application *)local_110,&local_130,&local_168,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::function<std::shared_ptr<webpp::Response>_(webpp::Request_&)>::~function(&local_168);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  webpp::Application::run((Application *)local_110);
  app._252_4_ = 0;
  webpp::Application::~Application((Application *)local_110);
  return app._252_4_;
}

Assistant:

int main() {
  Application app(12345, 4);

  app.add_route("/", [](Request& request) {
    auto response = make_shared<Response>("Hello, World!");

    return response;
  });

  app.run();

  return 0;
}